

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

int big_block_flush(BigBlock *block)

{
  BigAttr *pBVar1;
  BigAttr *pBVar2;
  uint uVar3;
  BigAttrSet *pBVar4;
  int iVar5;
  int iVar6;
  FILE *pFVar7;
  void *__ptr;
  ulong uVar8;
  char *__dest;
  size_t sVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  char *dtype;
  ulong uVar14;
  long lVar15;
  char buf [128];
  
  if (block->dirty == 0) {
LAB_00103f69:
    pBVar4 = block->attrset;
    if (pBVar4->dirty == 0) {
      return 0;
    }
    pcVar11 = block->basename;
    pBVar4->dirty = 0;
    pFVar7 = (FILE *)_big_file_open_a_file(pcVar11,-3,"w",1);
    if (pFVar7 == (FILE *)0x0) {
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x621);
    }
    else {
      uVar13 = 0;
      do {
        if (pBVar4->listused <= uVar13) {
          fclose(pFVar7);
          block->attrset->dirty = 0;
          return 0;
        }
        pBVar1 = pBVar4->attrlist + uVar13;
        pBVar2 = pBVar4->attrlist + uVar13;
        dtype = pBVar2->dtype;
        iVar5 = big_file_dtype_itemsize(dtype);
        uVar14 = (long)pBVar2->nmemb * (long)iVar5;
        __ptr = malloc(uVar14 * 2 + 1);
        pcVar11 = pBVar2->data;
        uVar8 = 0;
        if (0 < (int)uVar14) {
          uVar8 = uVar14 & 0xffffffff;
        }
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          *(char *)((long)__ptr + uVar10 * 2) = "0123456789ABCDEF"[(byte)pcVar11[uVar10] >> 4];
          *(char *)((long)__ptr + uVar10 * 2 + 1) = "0123456789ABCDEF"[(byte)pcVar11[uVar10] & 0xf];
        }
        *(undefined1 *)((long)__ptr + uVar10 * 2) = 0;
        if ((int)uVar14 < 0x81) {
          __dest = (char *)malloc((long)pBVar1->nmemb * 0x20 + 1);
          *__dest = '\0';
          lVar15 = 0;
          for (uVar8 = 0; (long)uVar8 < (long)pBVar1->nmemb; uVar8 = uVar8 + 1) {
            if ((pBVar1->dtype[1] == 'a') ||
               ((pBVar1->dtype[1] == 'S' && (iVar6 = big_file_dtype_itemsize(dtype), iVar6 == 1))))
            {
              buf[0] = pcVar11[uVar8];
              buf[1] = '\0';
              if (buf[0] == '\0') break;
              if (buf[0] == '\n') {
                sVar9 = strlen(__dest);
                builtin_strncpy(__dest + sVar9,"...",4);
                break;
              }
              strcat(__dest,buf);
            }
            else {
              big_file_dtype_format(buf,dtype,pcVar11 + lVar15,(char *)0x0);
              strcat(__dest,buf);
              if (uVar8 != pBVar1->nmemb - 1) {
                sVar9 = strlen(__dest);
                (__dest + sVar9)[0] = ' ';
                (__dest + sVar9)[1] = '\0';
              }
            }
            lVar15 = lVar15 + iVar5;
          }
        }
        else {
          __dest = _strdup("... (Too Long) ");
        }
        iVar5 = fprintf(pFVar7,"%s %s %d %s #HUMANE [ %s ]\n",pBVar1->name,dtype,
                        (ulong)(uint)pBVar1->nmemb,__ptr,__dest);
        free(__ptr);
        free(__dest);
        uVar13 = uVar13 + 1;
      } while (0 < iVar5);
      _big_file_raise("Failed to write to file",
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x656);
      fclose(pFVar7);
    }
    iVar5 = 0x264;
  }
  else {
    pFVar7 = (FILE *)_big_file_open_a_file(block->basename,-1,"w+",1);
    if (pFVar7 != (FILE *)0x0) {
      iVar5 = fprintf(pFVar7,"DTYPE: %s\n",block);
      if (((iVar5 < 0) ||
          (iVar5 = fprintf(pFVar7,"NMEMB: %d\n",(ulong)(uint)block->nmemb), iVar5 < 0)) ||
         (iVar5 = fprintf(pFVar7,"NFILE: %d\n",(ulong)(uint)block->Nfile), iVar5 < 0)) {
        pcVar11 = "Writing file header";
        iVar5 = 0x256;
      }
      else {
        uVar13 = 0;
        do {
          if ((long)block->Nfile <= (long)uVar13) {
            fclose(pFVar7);
            block->dirty = 0;
            goto LAB_00103f69;
          }
          uVar3 = block->fchecksum[uVar13];
          uVar12 = (uVar3 >> 0x10) + (uVar3 & 0xffff);
          iVar5 = fprintf(pFVar7,"%06X: %td : %u : %u\n",uVar13 & 0xffffffff,block->fsize[uVar13],
                          (ulong)uVar3,(ulong)((uVar12 >> 0x10) + (uVar12 & 0xffff)));
          uVar13 = uVar13 + 1;
        } while (-1 < iVar5);
        pcVar11 = "Writing file information to header";
        iVar5 = 0x25c;
      }
      _big_file_raise(pcVar11,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,iVar5);
      fclose(pFVar7);
      return -1;
    }
    iVar5 = 0x250;
  }
  _big_file_raise((char *)0x0,
                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                  ,iVar5);
  return -1;
}

Assistant:

int
big_block_flush(BigBlock * block)
{
    FILE * fheader = NULL;
    if(block->dirty) {
        int i;
        fheader = _big_file_open_a_file(block->basename, FILEID_HEADER, "w+", 1);
        RAISEIF(fheader == NULL, ex_fileio, NULL);
        RAISEIF(
            (0 > fprintf(fheader, "DTYPE: %s\n", block->dtype)) ||
            (0 > fprintf(fheader, "NMEMB: %d\n", block->nmemb)) ||
            (0 > fprintf(fheader, "NFILE: %d\n", block->Nfile)),
                ex_fprintf,
                "Writing file header");
        for(i = 0; i < block->Nfile; i ++) {
            unsigned int s = block->fchecksum[i];
            unsigned int r = (s & 0xffff) + ((s & 0xffffffff) >> 16);
            unsigned int checksum = (r & 0xffff) + (r >> 16);
            RAISEIF(0 > fprintf(fheader, EXT_DATA ": %td : %u : %u\n", i, block->fsize[i], block->fchecksum[i], checksum),
                ex_fprintf, "Writing file information to header");
        }
        fclose(fheader);
        block->dirty = 0;
    }
    if(block->attrset->dirty) {
        RAISEIF(0 != attrset_write_attr_set_v2(block->attrset, block->basename),
            ex_write_attr,
            NULL);
        block->attrset->dirty = 0;
    }
    return 0;

ex_fprintf:
    fclose(fheader);
ex_write_attr:
ex_fileio:
    return -1;
}